

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O1

CURLcode deflate_unencode_write(Curl_easy *data,contenc_writer *writer,char *buf,size_t nbytes)

{
  CURLcode CVar1;
  
  writer[1].downstream = (contenc_writer *)buf;
  *(int *)&writer[2].handler = (int)nbytes;
  if (*(int *)&writer[1].handler == 3) {
    CVar1 = process_trailer(data,(zlib_writer *)writer);
    return CVar1;
  }
  CVar1 = inflate_stream(data,writer,ZLIB_INFLATING);
  return CVar1;
}

Assistant:

static CURLcode deflate_unencode_write(struct Curl_easy *data,
                                       struct contenc_writer *writer,
                                       const char *buf, size_t nbytes)
{
  struct zlib_writer *zp = (struct zlib_writer *) writer;
  z_stream *z = &zp->z;     /* zlib state structure */

  /* Set the compressed input when this function is called */
  z->next_in = (Bytef *) buf;
  z->avail_in = (uInt) nbytes;

  if(zp->zlib_init == ZLIB_EXTERNAL_TRAILER)
    return process_trailer(data, zp);

  /* Now uncompress the data */
  return inflate_stream(data, writer, ZLIB_INFLATING);
}